

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_map_field.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::java::(anonymous_namespace)::WireType_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDescriptor *field)

{
  long lVar1;
  char *pcVar2;
  long *plVar3;
  string *extraout_RAX;
  string *psVar4;
  size_type *psVar5;
  string *local_48 [2];
  undefined1 local_38 [16];
  undefined1 local_28 [8];
  _func_void_FieldDescriptor_ptr *local_20;
  
  if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
    local_20 = google::protobuf::FieldDescriptor::TypeOnceInit;
    local_28 = (undefined1  [8])this;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(this + 0x30),&local_20,(FieldDescriptor **)local_28);
  }
  pcVar2 = FieldTypeName(*(Type *)(this + 0x38));
  std::__cxx11::string::string((string *)local_48,pcVar2,(allocator *)&local_20);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_48,0,(char *)0x0,0x2b13fa);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar5) {
    lVar1 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  psVar4 = (string *)local_38;
  if (local_48[0] != psVar4) {
    operator_delete(local_48[0]);
    psVar4 = extraout_RAX;
  }
  return psVar4;
}

Assistant:

std::string WireType(const FieldDescriptor* field) {
  return "com.google.protobuf.WireFormat.FieldType." +
         std::string(FieldTypeName(field->type()));
}